

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O2

void __thiscall
OpenMesh::PropertyT<OpenMesh::Attributes::StatusInfo>::push_back
          (PropertyT<OpenMesh::Attributes::StatusInfo> *this)

{
  StatusInfo local_c;
  
  local_c.status_ = 0;
  std::vector<OpenMesh::Attributes::StatusInfo,_std::allocator<OpenMesh::Attributes::StatusInfo>_>::
  emplace_back<OpenMesh::Attributes::StatusInfo>(&this->data_,&local_c);
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }